

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O2

error builtin_greater(vector *vargs,atom *result)

{
  double *pdVar1;
  double dVar2;
  atom *paVar3;
  int iVar4;
  anon_union_8_9_1d3277aa_for_value *paVar5;
  ulong uVar6;
  undefined8 uVar7;
  anon_union_8_9_1d3277aa_for_value aVar8;
  
  uVar6 = vargs->size;
  if (uVar6 < 2) {
LAB_00105dcc:
    uVar7 = sym_t._0_8_;
    aVar8 = sym_t.value;
  }
  else {
    paVar3 = vargs->data;
    if (paVar3->type == T_NUM) {
      paVar5 = &paVar3[1].value;
      do {
        uVar6 = uVar6 - 1;
        if (uVar6 == 0) goto LAB_00105dcc;
        dVar2 = paVar5->number;
        pdVar1 = (double *)(paVar5 + -2);
        paVar5 = paVar5 + 2;
      } while (dVar2 < *pdVar1);
    }
    else {
      if (paVar3->type != T_STRING) {
        return ERROR_TYPE;
      }
      paVar5 = &paVar3[1].value;
      do {
        uVar6 = uVar6 - 1;
        if (uVar6 == 0) goto LAB_00105dcc;
        iVar4 = strcmp((paVar5[-2].str)->value,paVar5->str->value);
        paVar5 = paVar5 + 2;
      } while (0 < iVar4);
    }
    uVar7 = 0;
    aVar8.number = 0.0;
  }
  *(undefined8 *)result = uVar7;
  result->value = aVar8;
  return ERROR_OK;
}

Assistant:

error builtin_greater(struct vector *vargs, atom *result)
{
	if (vargs->size <= 1) {
		*result = sym_t;
		return ERROR_OK;
	}
	size_t i;
	switch (vargs->data[0].type) {
	case T_NUM:
		for (i = 0; i < vargs->size - 1; i++) {
			if (vargs->data[i].value.number <= vargs->data[i + 1].value.number) {
				*result = nil;
				return ERROR_OK;
			}
		}
		*result = sym_t;
		return ERROR_OK;
	case T_STRING:
		for (i = 0; i < vargs->size - 1; i++) {
			if (strcmp(vargs->data[i].value.str->value, vargs->data[i + 1].value.str->value) <= 0) {
				*result = nil;
				return ERROR_OK;
			}
		}
		*result = sym_t;
		return ERROR_OK;
	default:
		return ERROR_TYPE;
	}
}